

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

null_terminating_iterator<char> __thiscall
fmt::v5::internal::
parse_arg_id<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>&,char>>
          (internal *this,null_terminating_iterator<char> it,
          id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_&,_char>
          *handler)

{
  long lVar1;
  internal iVar2;
  long *plVar3;
  internal *piVar4;
  uint id;
  internal *piVar5;
  internal *piVar6;
  null_terminating_iterator<char> nVar7;
  basic_string_view<char> name;
  anon_union_16_11_26d04ec8_for_value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_1
  local_48;
  undefined4 local_38;
  
  plVar3 = (long *)it.end_;
  piVar4 = (internal *)it.ptr_;
  if (this == piVar4) {
    iVar2 = (internal)0x0;
  }
  else {
    iVar2 = *this;
    if ((iVar2 == (internal)0x7d) || (iVar2 == (internal)0x3a)) {
      lVar1 = *plVar3;
      basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
      ::next_arg((format_arg *)&local_48.string,
                 (basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
                  *)(lVar1 + 8));
      *(undefined4 *)(lVar1 + 0x60) = local_38;
      *(longlong *)(lVar1 + 0x50) = local_48.long_long_value;
      *(size_t *)(lVar1 + 0x58) = local_48.string.size;
      piVar6 = this;
      goto LAB_0011ed70;
    }
    if ((byte)((char)iVar2 - 0x30U) < 10) {
      id = 0;
      piVar5 = this + 1;
      do {
        if (0xccccccc < id) goto LAB_0011ed97;
        id = ((uint)(byte)iVar2 + id * 10) - 0x30;
        piVar6 = piVar4;
        if (piVar5 == piVar4) break;
        iVar2 = *piVar5;
        piVar6 = piVar5;
        piVar5 = piVar5 + 1;
      } while ((byte)((char)iVar2 - 0x30U) < 10);
      if ((int)id < 0) {
LAB_0011ed97:
        error_handler::on_error((error_handler *)*plVar3,"number is too big");
      }
      if ((piVar6 != piVar4) && ((*piVar6 == (internal)0x3a || (*piVar6 == (internal)0x7d)))) {
        format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        ::on_arg_id((format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                     *)*plVar3,id);
        goto LAB_0011ed70;
      }
      goto LAB_0011ecfd;
    }
  }
  if ((iVar2 != (internal)0x5f) && (0x19 < (byte)(((byte)iVar2 & 0xdf) + 0xbf))) {
LAB_0011ecfd:
    error_handler::on_error((error_handler *)*plVar3,"invalid format string");
  }
  name.size_ = 0;
  piVar5 = this + 1;
  do {
    piVar6 = piVar5;
    if (piVar6 == piVar4) {
      iVar2 = (internal)0x0;
    }
    else {
      iVar2 = *piVar6;
    }
    piVar5 = piVar6 + 1;
    name.size_ = name.size_ + 1;
  } while ((((byte)((char)iVar2 - 0x30U) < 10) || (iVar2 == (internal)0x5f)) ||
          ((byte)(((byte)iVar2 & 0xdf) + 0xbf) < 0x1a));
  if ((long)name.size_ < 0) {
    __assert_fail("(value >= 0) && \"negative value\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/fireice-uk[P]gulps/fmt/core.h"
                  ,0xde,
                  "typename std::make_unsigned<Int>::type fmt::internal::to_unsigned(Int) [Int = long]"
                 );
  }
  lVar1 = *plVar3;
  name.data_ = (char *)this;
  basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>::
  get_arg((format_arg *)&local_48.string,
          (basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
           *)(lVar1 + 8),name);
  *(undefined4 *)(lVar1 + 0x60) = local_38;
  *(longlong *)(lVar1 + 0x50) = local_48.long_long_value;
  *(size_t *)(lVar1 + 0x58) = local_48.string.size;
LAB_0011ed70:
  nVar7.end_ = (char *)piVar4;
  nVar7.ptr_ = (char *)piVar6;
  return nVar7;
}

Assistant:

FMT_CONSTEXPR Iterator parse_arg_id(Iterator it, IDHandler &&handler) {
  typedef typename std::iterator_traits<Iterator>::value_type char_type;
  char_type c = *it;
  if (c == '}' || c == ':') {
    handler();
    return it;
  }
  if (c >= '0' && c <= '9') {
    unsigned index = parse_nonnegative_int(it, handler);
    if (*it != '}' && *it != ':') {
      handler.on_error("invalid format string");
      return it;
    }
    handler(index);
    return it;
  }
  if (!is_name_start(c)) {
    handler.on_error("invalid format string");
    return it;
  }
  auto start = it;
  do {
    c = *++it;
  } while (is_name_start(c) || ('0' <= c && c <= '9'));
  handler(basic_string_view<char_type>(
            pointer_from(start), to_unsigned(it - start)));
  return it;
}